

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::SetVectorString<unsigned_int>(Vector *vector,idx_t size,char *cdata,uint *offsets)

{
  uint uVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  data_ptr_t pdVar4;
  char *__src;
  ulong uVar5;
  uint uVar6;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_40;
  char *local_38;
  
  if (size != 0) {
    pdVar4 = vector->data + 4;
    uVar5 = 0;
    local_38 = cdata;
    do {
      puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0)) {
        uVar1 = offsets[uVar5];
        uVar6 = offsets[uVar5 + 1] - uVar1;
        __src = cdata + uVar1;
        if (uVar6 < 0xd) {
          local_40 = 0;
          local_48 = 0;
          uStack_44 = 0;
          pcVar3 = (char *)0x0;
          if (offsets[uVar5 + 1] != uVar1) {
            switchD_015de399::default(&local_48,__src,(ulong)uVar6);
            cdata = local_38;
            pcVar3 = (char *)CONCAT44(local_40,uStack_44);
          }
        }
        else {
          local_48 = *(undefined4 *)__src;
          pcVar3 = __src;
        }
        local_40 = (undefined4)((ulong)pcVar3 >> 0x20);
        uStack_44 = SUB84(pcVar3,0);
        *(uint *)(pdVar4 + -4) = uVar6;
        *(ulong *)pdVar4 = CONCAT44(uStack_44,local_48);
        *(undefined4 *)(pdVar4 + 8) = local_40;
      }
      uVar5 = uVar5 + 1;
      pdVar4 = pdVar4 + 0x10;
    } while (size != uVar5);
  }
  return;
}

Assistant:

static void SetVectorString(Vector &vector, idx_t size, char *cdata, T *offsets) {
	auto strings = FlatVector::GetData<string_t>(vector);
	for (idx_t row_idx = 0; row_idx < size; row_idx++) {
		if (FlatVector::IsNull(vector, row_idx)) {
			continue;
		}
		auto cptr = cdata + offsets[row_idx];
		auto str_len = offsets[row_idx + 1] - offsets[row_idx];
		if (str_len > NumericLimits<uint32_t>::Maximum()) { // LCOV_EXCL_START
			throw ConversionException("DuckDB does not support Strings over 4GB");
		} // LCOV_EXCL_STOP
		strings[row_idx] = string_t(cptr, UnsafeNumericCast<uint32_t>(str_len));
	}
}